

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadsavemenu.cpp
# Opt level: O0

int __thiscall DLoadSaveMenu::RemoveSaveSlot(DLoadSaveMenu *this,int index)

{
  FSaveGameNode *this_00;
  FSaveGameNode *pFVar1;
  uint uVar2;
  FSaveGameNode **ppFVar3;
  FSaveGameNode *file;
  int index_local;
  DLoadSaveMenu *this_local;
  
  ppFVar3 = TArray<FSaveGameNode_*,_FSaveGameNode_*>::operator[](&SaveGames,(long)index);
  pFVar1 = quickSaveSlot;
  this_00 = *ppFVar3;
  ppFVar3 = TArray<FSaveGameNode_*,_FSaveGameNode_*>::operator[](&SaveGames,(long)index);
  if (pFVar1 == *ppFVar3) {
    quickSaveSlot = (FSaveGameNode *)0x0;
  }
  if (this->Selected == index) {
    this->Selected = -1;
  }
  if (((this_00->bNoDelete & 1U) == 0) && (this_00 != (FSaveGameNode *)0x0)) {
    FSaveGameNode::~FSaveGameNode(this_00);
    operator_delete(this_00,0x28);
  }
  TArray<FSaveGameNode_*,_FSaveGameNode_*>::Delete(&SaveGames,index);
  uVar2 = TArray<FSaveGameNode_*,_FSaveGameNode_*>::Size(&SaveGames);
  file._4_4_ = index;
  if (uVar2 <= (uint)index) {
    file._4_4_ = index + -1;
  }
  return file._4_4_;
}

Assistant:

int DLoadSaveMenu::RemoveSaveSlot (int index)
{
	FSaveGameNode *file = SaveGames[index];

	if (quickSaveSlot == SaveGames[index])
	{
		quickSaveSlot = NULL;
	}
	if (Selected == index)
	{
		Selected = -1;
	}
	if (!file->bNoDelete) delete file;
	SaveGames.Delete(index);
	if ((unsigned)index >= SaveGames.Size()) index--;
	return index;
}